

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O3

_Bool array_container_intersect(array_container_t *array1,array_container_t *array2)

{
  int iVar1;
  int iVar2;
  _Bool _Var3;
  size_t lenA;
  size_t lenB;
  
  iVar1 = array1->cardinality;
  lenA = (size_t)iVar1;
  iVar2 = array2->cardinality;
  lenB = (size_t)iVar2;
  if (iVar1 * 0x40 < iVar2) {
    _Var3 = intersect_skewed_uint16_nonempty(array1->array,lenA,array2->array,lenB);
    return _Var3;
  }
  if (iVar2 * 0x40 < iVar1) {
    _Var3 = intersect_skewed_uint16_nonempty(array2->array,lenB,array1->array,lenA);
    return _Var3;
  }
  _Var3 = intersect_uint16_nonempty(array1->array,lenA,array2->array,lenB);
  return _Var3;
}

Assistant:

bool array_container_intersect(const array_container_t *array1,
                               const array_container_t *array2) {
    int32_t card_1 = array1->cardinality, card_2 = array2->cardinality;
    const int threshold = 64;  // subject to tuning
    if (card_1 * threshold < card_2) {
        return intersect_skewed_uint16_nonempty(array1->array, card_1,
                                                array2->array, card_2);
    } else if (card_2 * threshold < card_1) {
        return intersect_skewed_uint16_nonempty(array2->array, card_2,
                                                array1->array, card_1);
    } else {
        // we do not bother vectorizing
        return intersect_uint16_nonempty(array1->array, card_1, array2->array,
                                         card_2);
    }
}